

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

ostream * __thiscall smf::Options::printRegister(Options *this,ostream *out)

{
  pointer ppOVar1;
  
  ppOVar1 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppOVar1 !=
      (this->m_optionRegister).
      super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      Option_register::print(*ppOVar1,out);
      ppOVar1 = ppOVar1 + 1;
    } while (ppOVar1 !=
             (this->m_optionRegister).
             super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return out;
}

Assistant:

std::ostream& Options::printRegister(std::ostream& out) {
   for (auto it = m_optionRegister.begin(); it != m_optionRegister.end(); it++) {
      (*it)->print(out);
   }
   return out;
}